

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void copysymboltypeinfo(MOJOSHADER_symbolTypeInfo *dst,MOJOSHADER_symbolTypeInfo *src,
                       MOJOSHADER_malloc m,void *d)

{
  MOJOSHADER_symbolType MVar1;
  uint uVar2;
  MOJOSHADER_symbolStructMember *pMVar3;
  size_t sVar4;
  char *__dest;
  char *stringcopy;
  uint32 siz;
  int i;
  void *d_local;
  MOJOSHADER_malloc m_local;
  MOJOSHADER_symbolTypeInfo *src_local;
  MOJOSHADER_symbolTypeInfo *dst_local;
  
  MVar1 = src->parameter_type;
  dst->parameter_class = src->parameter_class;
  dst->parameter_type = MVar1;
  uVar2 = src->columns;
  dst->rows = src->rows;
  dst->columns = uVar2;
  uVar2 = src->member_count;
  dst->elements = src->elements;
  dst->member_count = uVar2;
  dst->members = src->members;
  if (dst->member_count != 0) {
    pMVar3 = (MOJOSHADER_symbolStructMember *)(*m)(dst->member_count * 0x28,d);
    dst->members = pMVar3;
    for (stringcopy._4_4_ = 0; stringcopy._4_4_ < dst->member_count;
        stringcopy._4_4_ = stringcopy._4_4_ + 1) {
      if (src->members[(int)stringcopy._4_4_].name != (char *)0x0) {
        sVar4 = strlen(src->members[(int)stringcopy._4_4_].name);
        __dest = (char *)(*m)((int)sVar4 + 1,d);
        strcpy(__dest,src->members[(int)stringcopy._4_4_].name);
        dst->members[(int)stringcopy._4_4_].name = __dest;
      }
      copysymboltypeinfo(&dst->members[(int)stringcopy._4_4_].info,
                         &src->members[(int)stringcopy._4_4_].info,m,d);
    }
  }
  return;
}

Assistant:

void copysymboltypeinfo(MOJOSHADER_symbolTypeInfo *dst,
                        MOJOSHADER_symbolTypeInfo *src,
                        MOJOSHADER_malloc m,
                        void *d)
{
    int i;
    uint32 siz = 0;
    char *stringcopy = NULL;
    memcpy(dst, src, sizeof (MOJOSHADER_symbolTypeInfo));
    if (dst->member_count > 0)
    {
        siz = dst->member_count * sizeof (MOJOSHADER_symbolStructMember);
        dst->members = (MOJOSHADER_symbolStructMember *) m(siz, d);
        for (i = 0; i < dst->member_count; i++)
        {
            COPY_STRING(members[i].name)
            copysymboltypeinfo(&dst->members[i].info, &src->members[i].info, m, d);
        } // for
    } // if
}